

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.h
# Opt level: O0

void __thiscall sing::Buffer::append(Buffer *this,string *str)

{
  char *data;
  size_t len;
  string *str_local;
  Buffer *this_local;
  
  data = (char *)std::__cxx11::string::data();
  len = std::__cxx11::string::length();
  append(this,data,len);
  return;
}

Assistant:

void append(const std::string& str){ 
        append(str.data(), str.length()); 
    }